

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

bool __thiscall SimpleString::endsWith(SimpleString *this,SimpleString *other)

{
  char *str;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar2 = size(this);
  str = other->buffer_;
  sVar3 = StrLen(str);
  if (sVar3 == 0) {
    bVar4 = true;
  }
  else if (sVar2 < sVar3) {
    bVar4 = false;
  }
  else {
    iVar1 = StrCmp(this->buffer_ + (sVar2 - sVar3),str);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool SimpleString::endsWith(const SimpleString& other) const
{
    size_t buffer_length = size();
    size_t other_buffer_length = StrLen(other.buffer_);
    if (other_buffer_length == 0) return true;
    if (buffer_length == 0) return false;
    if (buffer_length < other_buffer_length) return false;
    return StrCmp(buffer_ + buffer_length - other_buffer_length, other.buffer_) == 0;
}